

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall
Liby::Connection::sendFile(Connection *this,fdPtr *fp,off_t off,off_t len,BasicHandler *handler)

{
  Channel *this_00;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  __uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
  this_01;
  pointer __p;
  bool bVar1;
  io_task task;
  function<void_()> *local_70;
  undefined1 local_68 [48];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_38;
  
  local_68._32_8_ = (element_type *)0x0;
  local_68._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_head_impl = (function<void_()> *)0x0;
  local_68._0_8_ = (fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
             &(fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  local_68._16_8_ = off;
  local_68._24_8_ = len;
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    this_01.
    super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
    super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
         (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)
         operator_new(0x20);
    std::function<void_()>::function
              ((function<void_()> *)
               this_01.
               super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
               .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl,handler);
    __ptr._M_head_impl = local_38._M_head_impl;
    local_70 = (function<void_()> *)0x0;
    bVar1 = local_38._M_head_impl != (function<void_()> *)0x0;
    local_38._M_head_impl =
         (function<void_()> *)
         this_01.
         super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
         .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
    if (bVar1) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_38,__ptr._M_head_impl);
    }
    if (local_70 != (function<void_()> *)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_70,local_70);
    }
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)local_68);
  this_00 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00->writable_ = true;
  Channel::updateChannel(this_00);
  if (local_38._M_head_impl != (function<void_()> *)0x0) {
    std::default_delete<std::function<void_()>_>::operator()
              ((default_delete<std::function<void_()>_> *)&local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (function<void_()> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._40_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void Connection::sendFile(const fdPtr &fp, off_t off, off_t len,
                          const BasicHandler &handler) {
    io_task task;
    task.fp_ = fp;
    task.offset_ = off;
    task.len_ = len;
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}